

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::OlsonTimeZone::getTimeZoneRules
          (OlsonTimeZone *this,InitialTimeZoneRule **initial,TimeZoneRule **trsrules,
          int32_t *trscount,UErrorCode *status)

{
  short sVar1;
  SimpleTimeZone *pSVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int32_t tmpcnt;
  InitialTimeZoneRule *tmpini;
  int local_3c;
  undefined1 local_38 [8];
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  checkTransitionRules(this,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    *initial = this->initialRule;
    iVar3 = *trscount;
    iVar5 = 0;
    if ((0 < iVar3 && this->historicRules != (TimeArrayTimeZoneRule **)0x0) &&
       (sVar1 = this->historicRuleCount, iVar5 = 0, 0 < (long)sVar1)) {
      lVar4 = 0;
      iVar5 = 0;
      do {
        if (this->historicRules[lVar4] != (TimeArrayTimeZoneRule *)0x0) {
          lVar6 = (long)iVar5;
          iVar5 = iVar5 + 1;
          trsrules[lVar6] = &this->historicRules[lVar4]->super_TimeZoneRule;
          if (iVar3 <= iVar5) break;
        }
        lVar4 = lVar4 + 1;
      } while (sVar1 != lVar4);
      iVar3 = *trscount;
    }
    pSVar2 = this->finalZoneWithStartYear;
    if ((pSVar2 != (SimpleTimeZone *)0x0) &&
       (local_3c = iVar3 - iVar5, local_3c != 0 && iVar5 <= iVar3)) {
      (*(pSVar2->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0x12])
                (pSVar2,local_38,trsrules + iVar5,&local_3c,status);
      if (U_ZERO_ERROR < *status) {
        return;
      }
      iVar5 = iVar5 + local_3c;
    }
    *trscount = iVar5;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }